

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleMakeCIdentifierCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  long lVar2;
  allocator local_41;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar2 == 0x60) {
    this_00 = (this->super_cmCommand).Makefile;
    cmsys::SystemTools::MakeCidentifier(&local_40,pbVar1 + 1);
    cmMakefile::AddDefinition(this_00,pbVar1 + 2,local_40._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command MAKE_C_IDENTIFIER requires two arguments.",&local_41
              );
    cmCommand::SetError(&this->super_cmCommand,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return lVar2 == 0x60;
}

Assistant:

bool cmStringCommand
::HandleMakeCIdentifierCommand(std::vector<std::string> const& args)
{
  if(args.size() != 3)
    {
    this->SetError("sub-command MAKE_C_IDENTIFIER requires two arguments.");
    return false;
    }

  const std::string& input = args[1];
  const std::string& variableName = args[2];

  this->Makefile->AddDefinition(variableName,
                      cmSystemTools::MakeCidentifier(input).c_str());
  return true;
}